

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNStm * __thiscall CTcParser::parse_for(CTcParser *this,int *err)

{
  CTPNStm **ppCVar1;
  uint uVar2;
  CTcTokFileDesc *pCVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  CTcTokenizer *this_00;
  CTPNForIn *pCVar7;
  int *piVar8;
  tc_toktyp_t tVar9;
  CVmHashEntry *pCVar10;
  CVmHashEntry *lval;
  CVmHashEntry *pCVar11;
  CTPNStmEnclosing *this_01;
  CTPNStmEnclosing *pCVar12;
  int *err_00;
  CVmHashEntry *pCVar13;
  size_t siz;
  CTPNStmEnclosing *pCVar14;
  CTPNForIn *in_head;
  CTPNForIn *in_tail;
  CTcTokFileDesc *local_78;
  CTcTokFileDesc *local_70;
  CTPNForIn *local_68;
  CTPNForIn *local_60;
  long local_58;
  CTcTokFileDesc *local_50;
  CTcPrsSymtab *local_48;
  CTcPrsSymtab *local_40;
  int *local_38;
  
  this_00 = G_tok;
  local_50 = G_tok->last_desc_;
  local_58 = G_tok->last_linenum_;
  local_40 = this->local_symtab_;
  local_48 = this->enclosing_local_symtab_;
  this->enclosing_local_symtab_ = local_40;
  local_38 = err;
  tVar9 = CTcTokenizer::next(this_00);
  if (tVar9 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    err = (int *)0x2b36;
    CTcTokenizer::log_error_curtok(G_tok,0x2b36);
  }
  local_68 = (CTPNForIn *)0x0;
  local_60 = (CTPNForIn *)0x0;
  bVar6 = false;
  bVar4 = false;
  pCVar13 = (CVmHashEntry *)0x0;
  do {
    pCVar10 = pCVar13;
    if (bVar4) break;
    tVar9 = (G_tok->curtok_).typ_;
    if ((int)tVar9 < 0x2a) {
      if (tVar9 - TOKT_LBRACE < 2) {
LAB_0023b4b7:
        err = (int *)0x2b3a;
        CTcTokenizer::log_error_curtok(G_tok,0x2b3a);
LAB_0023b569:
        bVar4 = true;
        goto LAB_0023b56f;
      }
      if (tVar9 == TOKT_RPAR) {
        if (!bVar6) goto LAB_0023b4b7;
        bVar6 = true;
        goto LAB_0023b569;
      }
LAB_0023b5fb:
      lval = (CVmHashEntry *)parse_asi_expr(this);
      if (lval == (CVmHashEntry *)0x0) {
        bVar4 = true;
      }
      pCVar11 = lval;
      bVar5 = bVar4;
      if ((((G_tok->curtok_).typ_ == TOKT_SYM) && ((G_tok->curtok_).text_len_ == 2)) &&
         (*(short *)(G_tok->curtok_).text_ == 0x6e69)) {
        CTcTokenizer::next(G_tok);
LAB_0023b6e8:
        pCVar11 = (CVmHashEntry *)parse_for_in_clause(this,(CTcPrsNode *)lval,&local_68,&local_60);
        bVar6 = true;
        err = (int *)lval;
        bVar5 = bVar4;
        if (pCVar11 == (CVmHashEntry *)0x0) {
          bVar5 = true;
        }
      }
    }
    else {
      if (tVar9 == TOKT_SEM) {
        bVar4 = true;
        if (pCVar13 != (CVmHashEntry *)0x0) {
          CTcTokenizer::log_error(0x2b39);
        }
      }
      else {
        if (tVar9 != TOKT_LOCAL) goto LAB_0023b5fb;
        create_scope_local_symtab(this);
        tVar9 = CTcTokenizer::next(G_tok);
        if (tVar9 == TOKT_SYM) {
          uVar2 = this->local_cnt_;
          siz = (size_t)uVar2;
          if (this->max_local_cnt_ <= (int)uVar2) {
            this->max_local_cnt_ = uVar2 + 1;
          }
          this->local_cnt_ = uVar2 + 1;
          err = (int *)CTcPrsSymtab::add_local(this->local_symtab_,uVar2);
          tVar9 = CTcTokenizer::next(G_tok);
          if (tVar9 == TOKT_SYM) {
            if (((G_tok->curtok_).text_len_ == 2) && (*(short *)(G_tok->curtok_).text_ == 0x6e69)) {
              CTcTokenizer::next(G_tok);
              lval = (CVmHashEntry *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,siz);
              lval->nxt_ = (CVmHashEntry *)err;
              (((CTcSymLocalBase *)&lval->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
              super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
                   (_func_int **)&PTR_gen_code_00362b00;
              goto LAB_0023b6e8;
            }
          }
          else if ((tVar9 == TOKT_ASI) || (tVar9 == TOKT_EQ)) {
            pCVar11 = (CVmHashEntry *)parse_local_initializer(this,(CTcSymLocal *)err,err_00);
            bVar5 = bVar4;
            goto LAB_0023b572;
          }
          err = (int *)0x2b38;
        }
        else {
          err = (int *)0x2b29;
        }
        CTcTokenizer::log_error_curtok(G_tok,(int)err);
      }
LAB_0023b56f:
      pCVar11 = (CVmHashEntry *)0x0;
      bVar5 = bVar4;
    }
LAB_0023b572:
    if ((pCVar11 != (CVmHashEntry *)0x0) && (pCVar10 = pCVar11, pCVar13 != (CVmHashEntry *)0x0)) {
      pCVar10 = (CVmHashEntry *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)err);
      pCVar10->nxt_ = pCVar13;
      pCVar10->str_ = (char *)pCVar11;
      (((CTcSymLocalBase *)&pCVar10->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
           (_func_int **)&PTR_gen_code_00360400;
    }
    bVar4 = true;
    if (!bVar5) {
      tVar9 = (G_tok->curtok_).typ_;
      if ((int)tVar9 < 0x17) {
        if (tVar9 == TOKT_RPAR) {
          if (!bVar6) goto LAB_0023b5d3;
        }
        else {
          if (tVar9 != TOKT_COMMA) goto LAB_0023b671;
LAB_0023b67e:
          CTcTokenizer::next(G_tok);
          bVar4 = false;
        }
      }
      else if (tVar9 - TOKT_LBRACE < 2) {
LAB_0023b5d3:
        err = (int *)0x2b3a;
        CTcTokenizer::log_error_curtok(G_tok,0x2b3a);
      }
      else if (tVar9 != TOKT_SEM) {
LAB_0023b671:
        err = (int *)0x2b3b;
        CTcTokenizer::log_error_curtok(G_tok,0x2b3b);
        goto LAB_0023b67e;
      }
    }
    pCVar13 = pCVar10;
  } while (!bVar5);
  tVar9 = (G_tok->curtok_).typ_;
  if (tVar9 == TOKT_RPAR) {
    CTcTokenizer::next(G_tok);
  }
  else if (tVar9 == TOKT_SEM) {
    CTcTokenizer::next(G_tok);
    if ((G_tok->curtok_).typ_ == TOKT_SEM) {
      local_78 = (CTcTokFileDesc *)0x0;
    }
    else {
      local_78 = (CTcTokFileDesc *)parse_cond_expr(this);
    }
    tVar9 = (G_tok->curtok_).typ_;
    if ((tVar9 - TOKT_LBRACE < 2) || (tVar9 == TOKT_RPAR)) {
      err = (int *)0x2b3a;
      CTcTokenizer::log_error_curtok(G_tok,0x2b3a);
LAB_0023b899:
      local_70 = (CTcTokFileDesc *)0x0;
    }
    else {
      if (tVar9 == TOKT_SEM) {
        CTcTokenizer::next(G_tok);
      }
      else {
        err = (int *)0x2b3c;
        CTcTokenizer::log_error_curtok(G_tok,0x2b3c);
      }
      if ((G_tok->curtok_).typ_ == TOKT_RPAR) goto LAB_0023b899;
      local_70 = (CTcTokFileDesc *)parse_expr(this);
    }
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      err = (int *)0x2b3d;
      CTcTokenizer::log_error_curtok(G_tok,0x2b3d);
    }
    goto LAB_0023b757;
  }
  local_70 = (CTcTokFileDesc *)0x0;
  local_78 = (CTcTokFileDesc *)0x0;
LAB_0023b757:
  this_01 = (CTPNStmEnclosing *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x70,(size_t)err);
  pCVar7 = local_68;
  pCVar3 = (CTcTokFileDesc *)this->local_symtab_;
  pCVar14 = this->enclosing_stm_;
  CTPNStmBase::CTPNStmBase((CTPNStmBase *)this_01);
  piVar8 = local_38;
  this_01->enclosing_ = pCVar14;
  this_01[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)pCVar10;
  this_01[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)local_78;
  this_01[1].super_CTPNStm.super_CTPNStmBase.file_ = local_70;
  this_01[1].super_CTPNStm.super_CTPNStmBase.linenum_ = (long)pCVar7;
  this_01[2].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
  this_01[1].enclosing_ = (CTPNStmEnclosing *)0x0;
  ppCVar1 = &this_01[2].super_CTPNStm.super_CTPNStmBase.next_stm_;
  *(byte *)ppCVar1 = *(byte *)ppCVar1 & 0xfe;
  (this_01->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00365400;
  pCVar14 = this->enclosing_stm_;
  this->enclosing_stm_ = this_01;
  pCVar12 = (CTPNStmEnclosing *)parse_stm(this,local_38,(CTPNStmSwitch *)0x0,0);
  this->enclosing_stm_ = pCVar14;
  pCVar14 = (CTPNStmEnclosing *)0x0;
  if (*piVar8 == 0) {
    this_01[1].enclosing_ = pCVar12;
    (this_01->super_CTPNStm).super_CTPNStmBase.file_ = local_50;
    (this_01->super_CTPNStm).super_CTPNStmBase.linenum_ = local_58;
    *(byte *)&this_01[2].super_CTPNStm.super_CTPNStmBase.next_stm_ =
         *(byte *)&this_01[2].super_CTPNStm.super_CTPNStmBase.next_stm_ & 0xfe |
         this->local_symtab_ != local_40;
    this->local_symtab_ = local_40;
    this->enclosing_local_symtab_ = local_48;
    pCVar14 = this_01;
  }
  return &pCVar14->super_CTPNStm;
}

Assistant:

CTPNStm *CTcParser::parse_for(int *err)
{
    /* save the current line information for later */
    CTcTokFileDesc *file;
    long linenum;
    G_tok->get_last_pos(&file, &linenum);

    /* 
     *   enter a scope, in case we create a local symbol table for local
     *   variables defined within the 'for' statement 
     */
    tcprs_scope_t scope_data;
    enter_scope(&scope_data);

    /* parse the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and proceed, assuming it was simply left out */
        G_tok->log_error_curtok(TCERR_REQ_FOR_LPAR);
    }

    /* we don't have any of the expressions yet */
    CTcPrsNode *init_expr = 0;
    CTcPrsNode *cond_expr = 0;
    CTcPrsNode *reinit_expr = 0;
    int found_in = FALSE;

    /* "in" expression list */
    CTPNForIn *in_head = 0, *in_tail = 0;

    /* parse the initializer list */
    for (int done = FALSE ; !done ; )
    {
        /* presume we won't find an expression on this round */
        CTcPrsNode *expr = 0;
        
        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_LOCAL:
            /* 
             *   if we haven't created our own symbol table local to the
             *   'for' loop, do so now 
             */
            create_scope_local_symtab();
            
            /* skip the 'local' keyword and get the local name */
            if (G_tok->next() == TOKT_SYM)
            {
                /* add the local symbol */
                CTcSymLocal *lcl = local_symtab_->add_local(alloc_local());

                /* check for the required initializer */
                switch(G_tok->next())
                {
                case TOKT_ASI:
                case TOKT_EQ:
                    /* parse the initializer */
                    expr = parse_local_initializer(lcl, err);
                    break;

                case TOKT_SYM:
                    /* check for an 'in' expression */
                    if (G_tok->getcur()->text_matches("in", 2))
                    {
                        /* parse the 'var in expr' or 'var in from..to' */
                        G_tok->next();
                        expr = parse_for_in_clause(
                            new CTPNSymResolved(lcl), in_head, in_tail);

                        /* note the "in" */
                        found_in = TRUE;

                        /* if that failed, stop scanning the initializer */
                        if (expr == 0)
                            done = TRUE;
                    }
                    else
                    {
                        /* anything else is an error */
                        goto req_asi;
                    }
                    break;
                    
                default:
                req_asi:
                    /* log an error - an initializer is required */
                    G_tok->log_error_curtok(TCERR_REQ_FOR_LOCAL_INIT);
                    break;
                }
            }
            else
            {
                /* 
                 *   the 'local' statement isn't constructed properly -
                 *   this is difficult to recover from intelligently, so
                 *   just log an error and keep going from here 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
                break;
            }
            break;

        case TOKT_SEM:
            /* it's a semicolon - we're done with the initializer list */
            done = TRUE;

            /* 
             *   if we have an expression already, it means that the
             *   previous token was a comma - this is an error, since we
             *   have a missing expression; log the error but continue
             *   anyway 
             */
            if (init_expr != 0)
                G_tok->log_error(TCERR_MISSING_FOR_INIT_EXPR);
            break;

        case TOKT_RPAR:
            /* if we found an "in", we can end early */
            if (found_in)
            {
                done = TRUE;
                break;
            }

            /* otherwise, fall through to the missing part error... */
            /* FALL THROUGH */

        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* premature end of the list - log an error and stop */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);
            done = TRUE;
            break;

        default:
            /* 
             *   This must be an expression - parse it.  Parse an
             *   assignment expression, not a comma expression, because we
             *   must check for a "local" clause after each comma. 
             */
            expr = parse_asi_expr();

            /* if that failed, stop scanning the "for" */
            if (expr == 0)
                done = TRUE;

            /* check for an 'in' expression */
            if (G_tok->cur() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* skip the "in" and parse the collection/range */
                G_tok->next();
                expr = parse_for_in_clause(expr, in_head, in_tail);

                /* note the "in" */
                found_in = TRUE;
                
                /* if that failed, stop parsing the initializer */
                if (expr == 0)
                    done = TRUE;
            }

            /* done with this clause */
            break;
        }

        /* 
         *   if we got an expression, add it into the initializer
         *   expression under construction by adding it under a "comma"
         *   node 
         */
        if (expr != 0)
        {
            /* 
             *   if there's an expression, build a comma expression for
             *   the expression so far plus the new expression; otherwise,
             *   the new expression becomes the entire expression so far 
             */
            if (init_expr != 0)
                init_expr = new CTPNComma(init_expr, expr);
            else
                init_expr = expr;
        }

        /* if we're done, we can stop now */
        if (done)
            break;

        /* 
         *   we must have a semicolon or comma after each initializer
         *   expression 
         */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* that's the end of the statement - stop now */
            done = TRUE;
            break;

        case TOKT_COMMA:
            /* skip the comma and parse the next initializer */
            G_tok->next();
            break;

        case TOKT_RPAR:
            /* if we found an "in" clause, we only need an initializer */
            if (found_in)
            {
                done = TRUE;
                break;
            }

            /* otherwise, fall through to the error case... */
            /* FALL THROUGH */
            
        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* log an error, and stop parsing the expression list */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);
            done = TRUE;
            break;

        default:
            /* log an error */
            G_tok->log_error_curtok(TCERR_REQ_FOR_INIT_COMMA);

            /* skip the errant token and keep going */
            G_tok->next();
            break;
        }
    }

    /* 
     *   if we successfully found the ';' at the end of the initializer
     *   list, parse the condition expression 
     */
    if (G_tok->cur() == TOKT_SEM)
    {
        int cont_to_reinit;

        /* presume we'll want to continue to the reinit expression */
        cont_to_reinit = TRUE;

        /* skip the ';' */
        G_tok->next();
        
        /* if the condition isn't empty, parse it */
        if (G_tok->cur() != TOKT_SEM)
            cond_expr = parse_cond_expr();

        /* require the ';' after the expression */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* it's fine - keep going from here */
            G_tok->next();
            break;

        case TOKT_RPAR:
        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* missing part */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);

            /* don't bother trying to find a reinitialization expression */
            cont_to_reinit = FALSE;
            break;

        default:
            /* 
             *   we seem to be missing the semicolon; keep going from
             *   here, assuming that they simply left out the semicolon
             *   between the condition and reinitializer expressions 
             */
            G_tok->log_error_curtok(TCERR_REQ_FOR_COND_SEM);
            break;
        }

        /* 
         *   if we're to continue to the reinitializer, parse it; there is
         *   no reinitialization expression if the next token is a right
         *   paren 
         */
        if (cont_to_reinit && G_tok->cur() != TOKT_RPAR)
        {
            /* parse the expression */
            reinit_expr = parse_expr();
        }

        /* make sure we have the right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* 
             *   log an error, and try parsing the body from here, on the
             *   assumption that they simply forgot about the right paren
             *   and jumped right into the body 
             */
            G_tok->log_error_curtok(TCERR_REQ_FOR_RPAR);
        }
    }
    else if (G_tok->cur() == TOKT_RPAR)
    {
        /* 
         *   We already found the right paren - early, so we logged an error
         *   if necessary (it's an error in most cases, but *not* if there's
         *   an 'in' clause in the initializer list).  Simply skip it now so
         *   that we can proceed to the body of the 'for'.  
         */
        G_tok->next();
    }

    /* create the "for" node */
    CTPNStmFor *for_stm = new CTPNStmFor(
        init_expr, cond_expr, reinit_expr, in_head,
        local_symtab_, enclosing_stm_);

    /* set the 'for' to enclose its body */
    CTPNStmEnclosing *old_enclosing = set_enclosing_stm(for_stm);

    /* parse the body of the "for" loop */
    CTPNStm *body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if that failed, return failure */
    if (*err)
        return 0;

    /* set the body of the 'for' */
    for_stm->set_body(body_stm);

    /* set the original statement position in the node */
    for_stm->set_source_pos(file, linenum);

    /* set the own-scope flag */
    for_stm->set_has_own_scope(local_symtab_ != scope_data.local_symtab);

    /* exit any local scope we created */
    leave_scope(&scope_data);

    /* return the "for" node */
    return for_stm;
}